

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O3

any * __thiscall
Omega_h::ExprOpsReader::at_reduce
          (any *__return_storage_ptr__,ExprOpsReader *this,int prod,
          vector<Omega_h::any,_std::allocator<Omega_h::any>_> *rhs)

{
  _Atomic_word *p_Var1;
  pointer psVar2;
  storage_union *psVar3;
  string *psVar4;
  Args *args_in;
  element_type *peVar5;
  vector<Omega_h::any,_std::allocator<Omega_h::any>_> *this_00;
  pointer paVar6;
  element_type *peVar7;
  element_type *peVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar9;
  long *plVar10;
  SemicolonOp *pSVar11;
  CallOp *pCVar12;
  vtable_type *pvVar13;
  MulOp *this_02;
  SubOp *this_03;
  OrOp *this_04;
  LtOp *this_05;
  AndOp *this_06;
  GtOp *this_07;
  AddOp *this_08;
  DivOp *this_09;
  PowOp *this_10;
  EqOp *this_11;
  AssignOp *this_12;
  TernaryOp *this_13;
  undefined8 *puVar14;
  ParserFail *pPVar15;
  pointer *ppsVar16;
  ulong uVar17;
  undefined8 uVar18;
  pointer psVar19;
  element_type eVar20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var21;
  pointer paVar22;
  any *paVar23;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_14;
  any *operand;
  Args args;
  ScopedTimer omega_h_scoped_function_timer;
  shared_ptr<Omega_h::ExprOp> op_rhs;
  string __str;
  undefined1 local_288 [39];
  ScopedTimer local_261;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  pointer local_250;
  long lStack_248;
  pointer local_240;
  SemicolonOp *local_238;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_230;
  SemicolonOp local_228;
  element_type local_200 [2];
  OpPtr local_1f0;
  OpPtr local_1e0;
  OpPtr local_1d0;
  OpPtr local_1c0;
  OpPtr local_1b0;
  OpPtr local_1a0;
  OpPtr local_190;
  OpPtr local_180;
  OpPtr local_170;
  OpPtr local_160;
  OpPtr local_150;
  OpPtr local_140;
  OpPtr local_130;
  OpPtr local_120;
  OpPtr local_110;
  OpPtr local_100;
  OpPtr local_f0;
  OpPtr local_e0;
  OpPtr local_d0;
  OpPtr local_c0;
  OpPtr local_b0;
  OpPtr local_a0;
  OpPtr local_90;
  OpPtr local_80;
  OpPtr local_70;
  OpPtr local_60;
  OpPtr local_50;
  OpPtr local_40;
  
  local_238 = &local_228;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_238,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp"
             ,"");
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_238);
  ppsVar16 = (pointer *)(plVar10 + 2);
  if ((pointer *)*plVar10 == ppsVar16) {
    local_250 = *ppsVar16;
    lStack_248 = plVar10[3];
    local_260._M_allocated_capacity = (size_type)&local_250;
  }
  else {
    local_250 = *ppsVar16;
    local_260._M_allocated_capacity = (size_type)(pointer *)*plVar10;
  }
  local_260._8_8_ = plVar10[1];
  *plVar10 = (long)ppsVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_228.rhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_200;
  std::__cxx11::string::_M_construct((ulong)&local_228.rhs,'\x04');
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_228.rhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,4,0x406);
  psVar2 = (pointer)((long)&(local_228.rhs.
                             super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->_vptr__Sp_counted_base + local_260._8_8_);
  psVar19 = (pointer)0xf;
  if ((pointer *)local_260._M_allocated_capacity != &local_250) {
    psVar19 = local_250;
  }
  if (psVar19 < psVar2) {
    eVar20._vptr_ExprOp = (_func_int **)(pointer)0xf;
    if (local_228.rhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        local_200) {
      eVar20._vptr_ExprOp = local_200[0]._vptr_ExprOp;
    }
    if (eVar20._vptr_ExprOp < psVar2) goto LAB_002ad5fc;
    plVar10 = (long *)std::__cxx11::string::replace
                                ((ulong)&local_228.rhs,0,(char *)0x0,local_260._M_allocated_capacity
                                );
  }
  else {
LAB_002ad5fc:
    plVar10 = (long *)std::__cxx11::string::_M_append
                                (local_260._M_local_buf,
                                 (ulong)local_228.rhs.
                                        super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr);
  }
  local_288._0_8_ = local_288 + 0x10;
  pCVar12 = (CallOp *)(plVar10 + 2);
  if ((CallOp *)*plVar10 == pCVar12) {
    local_288._16_8_ = (pCVar12->super_ExprOp)._vptr_ExprOp;
    local_288._24_8_ = plVar10[3];
  }
  else {
    local_288._16_8_ = (pCVar12->super_ExprOp)._vptr_ExprOp;
    local_288._0_8_ = (CallOp *)*plVar10;
  }
  local_288._8_8_ = plVar10[1];
  *plVar10 = (long)pCVar12;
  plVar10[1] = 0;
  *(undefined1 *)&(pCVar12->super_ExprOp)._vptr_ExprOp = 0;
  begin_code("at_reduce",(char *)local_288._0_8_);
  pCVar12 = (CallOp *)(local_288 + 0x10);
  if ((CallOp *)local_288._0_8_ != pCVar12) {
    operator_delete((void *)local_288._0_8_,(ulong)(local_288._16_8_ + 1));
  }
  if (local_228.rhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      local_200) {
    operator_delete(local_228.rhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,(ulong)((long)local_200[0]._vptr_ExprOp + 1));
  }
  if ((pointer *)local_260._M_allocated_capacity != &local_250) {
    operator_delete((void *)local_260._M_allocated_capacity,
                    (ulong)((long)&(local_250->
                                   super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>).
                                   _M_ptr + 1));
  }
  if (local_238 != &local_228) {
    operator_delete(local_238,(long)local_228.super_ExprOp._vptr_ExprOp + 1);
  }
  switch(prod) {
  case 0:
    operand = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar17 = ((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)operand >> 3) * -0x5555555555555555;
    if (uVar17 < 2) {
LAB_002af42c:
      uVar18 = 1;
LAB_002af2db:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar18,
                 uVar17);
    }
    pvVar13 = operand[1].vtable;
    if (pvVar13 == (vtable_type *)0x0) {
      pPVar15 = (ParserFail *)__cxa_allocate_exception(0x10);
      local_288._0_8_ = pCVar12;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_288,"Omega_h::ExprReader needs an expression to evaluate!","");
      ParserFail::ParserFail(pPVar15,(string *)local_288);
      __cxa_throw(pPVar15,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
    }
    if (operand->vtable == (vtable_type *)0x0) {
      __return_storage_ptr__->vtable = pvVar13;
LAB_002ae061:
      (*pvVar13->move)(&operand[1].storage,&__return_storage_ptr__->storage);
      operand[1].vtable = (vtable_type *)0x0;
      goto LAB_002aef90;
    }
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)local_288,operand);
    paVar22 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)(((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)paVar22 >> 3) *
               -0x5555555555555555) < 2) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
    }
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)local_260._M_local_buf,paVar22 + 1);
    pSVar11 = (SemicolonOp *)operator_new(0x28);
    local_40.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_288._0_8_;
    local_40.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_;
    if ((pointer)local_288._8_8_ != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)((long)(storage_union *)local_288._8_8_ + 8);
        *p_Var1 = *p_Var1 + 1;
        UNLOCK();
      }
      else {
        p_Var1 = (_Atomic_word *)((long)(storage_union *)local_288._8_8_ + 8);
        *p_Var1 = *p_Var1 + 1;
      }
    }
    local_50.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_260._M_allocated_capacity;
    local_50.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_260._8_8_ + 8) = *(_Atomic_word *)(local_260._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_260._8_8_ + 8) = *(_Atomic_word *)(local_260._8_8_ + 8) + 1;
      }
    }
    SemicolonOp::SemicolonOp(pSVar11,&local_40,&local_50);
    local_238 = pSVar11;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Omega_h::SemicolonOp*>
              (&_Stack_230,pSVar11);
    _Var21._M_pi = _Stack_230._M_pi;
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::shared_ptr<Omega_h::ExprOp>>()::table;
    _Stack_230._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->storage).dynamic = local_238;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&__return_storage_ptr__->storage + 8) =
         _Var21._M_pi;
    local_238 = (SemicolonOp *)0x0;
    _Var21._M_pi = local_40.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
    if (local_50.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_50.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var21._M_pi = local_40.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
    }
    goto LAB_002af2a1;
  default:
    __return_storage_ptr__->vtable = (vtable_type *)0x0;
    goto LAB_002aef90;
  case 2:
    operand = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    paVar23 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    uVar17 = ((long)paVar23 - (long)operand >> 3) * -0x5555555555555555;
    if (paVar23 == operand) {
      uVar18 = 0;
      goto LAB_002af2db;
    }
    if (operand->vtable == (vtable_type *)0x0) {
      if (1 < uVar17) {
        pvVar13 = operand[1].vtable;
        __return_storage_ptr__->vtable = pvVar13;
        if (pvVar13 == (vtable_type *)0x0) goto LAB_002aef90;
        goto LAB_002ae061;
      }
      goto LAB_002af42c;
    }
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)local_288,operand);
    paVar22 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)(((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)paVar22 >> 3) *
               -0x5555555555555555) < 2) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
    }
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)local_260._M_local_buf,paVar22 + 1);
    pSVar11 = (SemicolonOp *)operator_new(0x28);
    local_60.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_288._0_8_;
    local_60.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_;
    if ((pointer)local_288._8_8_ != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)((long)(storage_union *)local_288._8_8_ + 8);
        *p_Var1 = *p_Var1 + 1;
        UNLOCK();
      }
      else {
        p_Var1 = (_Atomic_word *)((long)(storage_union *)local_288._8_8_ + 8);
        *p_Var1 = *p_Var1 + 1;
      }
    }
    local_70.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_260._M_allocated_capacity;
    local_70.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_260._8_8_ + 8) = *(_Atomic_word *)(local_260._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_260._8_8_ + 8) = *(_Atomic_word *)(local_260._8_8_ + 8) + 1;
      }
    }
    SemicolonOp::SemicolonOp(pSVar11,&local_60,&local_70);
    local_238 = pSVar11;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Omega_h::SemicolonOp*>
              (&_Stack_230,pSVar11);
    _Var21._M_pi = _Stack_230._M_pi;
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::shared_ptr<Omega_h::ExprOp>>()::table;
    _Stack_230._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->storage).dynamic = local_238;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&__return_storage_ptr__->storage + 8) =
         _Var21._M_pi;
    local_238 = (SemicolonOp *)0x0;
    _Var21._M_pi = local_60.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
    if (local_70.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var21._M_pi = local_60.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
    }
LAB_002af2a1:
    if ((pointer)_Var21._M_pi != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var21._M_pi);
    }
    paVar22 = (pointer)local_288._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260._8_8_);
      paVar22 = (pointer)local_288._8_8_;
    }
joined_r0x002af011:
    if (paVar22 == (pointer)0x0) goto LAB_002aef90;
    goto LAB_002aef8b;
  case 3:
    paVar23 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
        super__Vector_impl_data._M_finish == paVar23) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    bVar9 = any::is_typed(paVar23,(type_info *)&std::__cxx11::string::typeinfo);
    if ((!bVar9) || (psVar4 = (string *)(paVar23->storage).dynamic, psVar4 == (string *)0x0)) {
      puVar14 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar14 = &PTR__bad_cast_004b86a8;
      __cxa_throw(puVar14,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    paVar22 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)(((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)paVar22 >> 3) *
               -0x5555555555555555) < 5) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",4);
    }
    bVar9 = any::is_typed(paVar22 + 4,(type_info *)&std::shared_ptr<Omega_h::ExprOp>::typeinfo);
    if (!bVar9) {
      puVar14 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar14 = &PTR__bad_cast_004b86a8;
      __cxa_throw(puVar14,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    peVar5 = (element_type *)paVar22[4].storage.dynamic;
    paVar22 = *(pointer *)((long)&paVar22[4].storage + 8);
    if (paVar22 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
        UNLOCK();
      }
      else {
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
      }
    }
    this_12 = (AssignOp *)operator_new(0x38);
    if (paVar22 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
        UNLOCK();
      }
      else {
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
      }
    }
    local_80.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
    local_80.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)paVar22;
    AssignOp::AssignOp(this_12,psVar4,&local_80);
    local_288._0_8_ = this_12;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Omega_h::AssignOp*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8),this_12);
    uVar18 = local_288._8_8_;
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::shared_ptr<Omega_h::ExprOp>>()::table;
    local_288._8_8_ = (pointer)0x0;
    (__return_storage_ptr__->storage).dynamic = (void *)local_288._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->storage + 8) = uVar18;
    local_288._0_8_ = (CallOp *)0x0;
    if ((pointer)local_80.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_80.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    goto joined_r0x002af011;
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0x1e:
  case 0x23:
    psVar3 = &((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
               super__Vector_impl_data._M_start)->storage;
    if (&((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
          super__Vector_impl_data._M_finish)->storage == psVar3) {
      uVar18 = 0;
      uVar17 = 0;
      goto LAB_002af2db;
    }
    pvVar13 = (vtable_type *)psVar3[1].dynamic;
    __return_storage_ptr__->vtable = pvVar13;
    if (pvVar13 != (vtable_type *)0x0) {
      (*pvVar13->move)(psVar3,&__return_storage_ptr__->storage);
      psVar3[1].dynamic = (void *)0x0;
    }
    goto LAB_002aef90;
  case 0xe:
    paVar23 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
        super__Vector_impl_data._M_finish == paVar23) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    bVar9 = any::is_typed(paVar23,(type_info *)&std::shared_ptr<Omega_h::ExprOp>::typeinfo);
    if (!bVar9) {
      puVar14 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar14 = &PTR__bad_cast_004b86a8;
      __cxa_throw(puVar14,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    peVar5 = (element_type *)(paVar23->storage).dynamic;
    local_240 = *(pointer *)((long)&paVar23->storage + 8);
    if (local_240 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)((long)&local_240->storage + 8);
        *p_Var1 = *p_Var1 + 1;
        UNLOCK();
      }
      else {
        p_Var1 = (_Atomic_word *)((long)&local_240->storage + 8);
        *p_Var1 = *p_Var1 + 1;
      }
    }
    paVar22 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)(((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)paVar22 >> 3) *
               -0x5555555555555555) < 4) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",3);
    }
    bVar9 = any::is_typed(paVar22 + 3,(type_info *)&std::shared_ptr<Omega_h::ExprOp>::typeinfo);
    if (!bVar9) {
      puVar14 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar14 = &PTR__bad_cast_004b86a8;
      __cxa_throw(puVar14,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    peVar7 = (element_type *)paVar22[3].storage.dynamic;
    this_14 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&paVar22[3].storage + 8);
    if (this_14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_14->_M_use_count = this_14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_14->_M_use_count = this_14->_M_use_count + 1;
      }
    }
    paVar22 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)(((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)paVar22 >> 3) *
               -0x5555555555555555) < 7) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",6);
    }
    bVar9 = any::is_typed(paVar22 + 6,(type_info *)&std::shared_ptr<Omega_h::ExprOp>::typeinfo);
    if (!bVar9) {
      puVar14 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar14 = &PTR__bad_cast_004b86a8;
      __cxa_throw(puVar14,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    peVar8 = (element_type *)paVar22[6].storage.dynamic;
    this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&paVar22[6].storage + 8);
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
    }
    this_13 = (TernaryOp *)operator_new(0x38);
    paVar22 = local_240;
    local_90.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240;
    if (local_240 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)((long)&local_240->storage + 8);
        *p_Var1 = *p_Var1 + 1;
        UNLOCK();
      }
      else {
        p_Var1 = (_Atomic_word *)((long)&local_240->storage + 8);
        *p_Var1 = *p_Var1 + 1;
      }
    }
    if (this_14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_14->_M_use_count = this_14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_14->_M_use_count = this_14->_M_use_count + 1;
      }
    }
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
    }
    local_b0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar8;
    local_b0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         this_01;
    local_a0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar7;
    local_a0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         this_14;
    local_90.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
    TernaryOp::TernaryOp(this_13,&local_90,&local_a0,&local_b0);
    local_288._0_8_ = this_13;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Omega_h::TernaryOp*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8),this_13);
    uVar18 = local_288._8_8_;
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::shared_ptr<Omega_h::ExprOp>>()::table;
    local_288._8_8_ = (pointer)0x0;
    (__return_storage_ptr__->storage).dynamic = (void *)local_288._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->storage + 8) = uVar18;
    local_288._0_8_ = (CallOp *)0x0;
    if (local_b0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_a0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((pointer)local_90.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_90.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
    goto joined_r0x002aef79;
  case 0xf:
    paVar23 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
        super__Vector_impl_data._M_finish == paVar23) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    bVar9 = any::is_typed(paVar23,(type_info *)&std::shared_ptr<Omega_h::ExprOp>::typeinfo);
    if (!bVar9) {
      puVar14 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar14 = &PTR__bad_cast_004b86a8;
      __cxa_throw(puVar14,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    peVar5 = (element_type *)(paVar23->storage).dynamic;
    paVar22 = *(pointer *)((long)&paVar23->storage + 8);
    if (paVar22 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
        UNLOCK();
      }
      else {
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
      }
    }
    paVar6 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)paVar6 >> 3) *
               -0x5555555555555555) < 4) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",3);
    }
    bVar9 = any::is_typed(paVar6 + 3,(type_info *)&std::shared_ptr<Omega_h::ExprOp>::typeinfo);
    if (!bVar9) {
      puVar14 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar14 = &PTR__bad_cast_004b86a8;
      __cxa_throw(puVar14,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    peVar7 = (element_type *)paVar6[3].storage.dynamic;
    this_14 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&paVar6[3].storage + 8);
    if (this_14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_14->_M_use_count = this_14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_14->_M_use_count = this_14->_M_use_count + 1;
      }
    }
    this_04 = (OrOp *)operator_new(0x28);
    if (paVar22 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
        UNLOCK();
      }
      else {
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
      }
    }
    if (this_14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_14->_M_use_count = this_14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_14->_M_use_count = this_14->_M_use_count + 1;
      }
    }
    local_d0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar7;
    local_d0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         this_14;
    local_c0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
    local_c0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)paVar22;
    OrOp::OrOp(this_04,&local_c0,&local_d0);
    local_288._0_8_ = this_04;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Omega_h::OrOp*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8),this_04);
    uVar18 = local_288._8_8_;
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::shared_ptr<Omega_h::ExprOp>>()::table;
    local_288._8_8_ = (pointer)0x0;
    (__return_storage_ptr__->storage).dynamic = (void *)local_288._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->storage + 8) = uVar18;
    local_288._0_8_ = (CallOp *)0x0;
    _Var21._M_pi = local_c0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
    if (local_d0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var21._M_pi = local_c0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
    }
    break;
  case 0x10:
    paVar23 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
        super__Vector_impl_data._M_finish == paVar23) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    bVar9 = any::is_typed(paVar23,(type_info *)&std::shared_ptr<Omega_h::ExprOp>::typeinfo);
    if (!bVar9) {
      puVar14 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar14 = &PTR__bad_cast_004b86a8;
      __cxa_throw(puVar14,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    peVar5 = (element_type *)(paVar23->storage).dynamic;
    paVar22 = *(pointer *)((long)&paVar23->storage + 8);
    if (paVar22 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
        UNLOCK();
      }
      else {
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
      }
    }
    paVar6 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)paVar6 >> 3) *
               -0x5555555555555555) < 4) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",3);
    }
    bVar9 = any::is_typed(paVar6 + 3,(type_info *)&std::shared_ptr<Omega_h::ExprOp>::typeinfo);
    if (!bVar9) {
      puVar14 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar14 = &PTR__bad_cast_004b86a8;
      __cxa_throw(puVar14,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    peVar7 = (element_type *)paVar6[3].storage.dynamic;
    this_14 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&paVar6[3].storage + 8);
    if (this_14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_14->_M_use_count = this_14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_14->_M_use_count = this_14->_M_use_count + 1;
      }
    }
    this_06 = (AndOp *)operator_new(0x28);
    if (paVar22 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
        UNLOCK();
      }
      else {
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
      }
    }
    if (this_14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_14->_M_use_count = this_14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_14->_M_use_count = this_14->_M_use_count + 1;
      }
    }
    local_f0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar7;
    local_f0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         this_14;
    local_e0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
    local_e0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)paVar22;
    AndOp::AndOp(this_06,&local_e0,&local_f0);
    local_288._0_8_ = this_06;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Omega_h::AndOp*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8),this_06);
    uVar18 = local_288._8_8_;
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::shared_ptr<Omega_h::ExprOp>>()::table;
    local_288._8_8_ = (pointer)0x0;
    (__return_storage_ptr__->storage).dynamic = (void *)local_288._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->storage + 8) = uVar18;
    local_288._0_8_ = (CallOp *)0x0;
    _Var21._M_pi = local_e0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
    if (local_f0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var21._M_pi = local_e0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
    }
    break;
  case 0x11:
    paVar23 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
        super__Vector_impl_data._M_finish == paVar23) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    bVar9 = any::is_typed(paVar23,(type_info *)&std::shared_ptr<Omega_h::ExprOp>::typeinfo);
    if (!bVar9) {
      puVar14 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar14 = &PTR__bad_cast_004b86a8;
      __cxa_throw(puVar14,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    peVar5 = (element_type *)(paVar23->storage).dynamic;
    paVar22 = *(pointer *)((long)&paVar23->storage + 8);
    if (paVar22 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
        UNLOCK();
      }
      else {
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
      }
    }
    paVar6 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)paVar6 >> 3) *
               -0x5555555555555555) < 4) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",3);
    }
    bVar9 = any::is_typed(paVar6 + 3,(type_info *)&std::shared_ptr<Omega_h::ExprOp>::typeinfo);
    if (!bVar9) {
      puVar14 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar14 = &PTR__bad_cast_004b86a8;
      __cxa_throw(puVar14,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    peVar7 = (element_type *)paVar6[3].storage.dynamic;
    this_14 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&paVar6[3].storage + 8);
    if (this_14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_14->_M_use_count = this_14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_14->_M_use_count = this_14->_M_use_count + 1;
      }
    }
    this_07 = (GtOp *)operator_new(0x28);
    if (paVar22 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
        UNLOCK();
      }
      else {
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
      }
    }
    if (this_14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_14->_M_use_count = this_14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_14->_M_use_count = this_14->_M_use_count + 1;
      }
    }
    local_110.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar7;
    local_110.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         this_14;
    local_100.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
    local_100.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)paVar22;
    GtOp::GtOp(this_07,&local_100,&local_110);
    local_288._0_8_ = this_07;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Omega_h::GtOp*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8),this_07);
    uVar18 = local_288._8_8_;
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::shared_ptr<Omega_h::ExprOp>>()::table;
    local_288._8_8_ = (pointer)0x0;
    (__return_storage_ptr__->storage).dynamic = (void *)local_288._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->storage + 8) = uVar18;
    local_288._0_8_ = (CallOp *)0x0;
    _Var21._M_pi = local_100.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
    if (local_110.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_110.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var21._M_pi = local_100.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
    }
    break;
  case 0x12:
    paVar23 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
        super__Vector_impl_data._M_finish == paVar23) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    bVar9 = any::is_typed(paVar23,(type_info *)&std::shared_ptr<Omega_h::ExprOp>::typeinfo);
    if (!bVar9) {
      puVar14 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar14 = &PTR__bad_cast_004b86a8;
      __cxa_throw(puVar14,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    peVar5 = (element_type *)(paVar23->storage).dynamic;
    paVar22 = *(pointer *)((long)&paVar23->storage + 8);
    if (paVar22 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
        UNLOCK();
      }
      else {
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
      }
    }
    paVar6 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)paVar6 >> 3) *
               -0x5555555555555555) < 4) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",3);
    }
    bVar9 = any::is_typed(paVar6 + 3,(type_info *)&std::shared_ptr<Omega_h::ExprOp>::typeinfo);
    if (!bVar9) {
      puVar14 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar14 = &PTR__bad_cast_004b86a8;
      __cxa_throw(puVar14,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    peVar7 = (element_type *)paVar6[3].storage.dynamic;
    this_14 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&paVar6[3].storage + 8);
    if (this_14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_14->_M_use_count = this_14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_14->_M_use_count = this_14->_M_use_count + 1;
      }
    }
    this_05 = (LtOp *)operator_new(0x28);
    if (paVar22 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
        UNLOCK();
      }
      else {
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
      }
    }
    if (this_14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_14->_M_use_count = this_14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_14->_M_use_count = this_14->_M_use_count + 1;
      }
    }
    local_130.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar7;
    local_130.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         this_14;
    local_120.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
    local_120.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)paVar22;
    LtOp::LtOp(this_05,&local_120,&local_130);
    local_288._0_8_ = this_05;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Omega_h::LtOp*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8),this_05);
    uVar18 = local_288._8_8_;
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::shared_ptr<Omega_h::ExprOp>>()::table;
    local_288._8_8_ = (pointer)0x0;
    (__return_storage_ptr__->storage).dynamic = (void *)local_288._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->storage + 8) = uVar18;
    local_288._0_8_ = (CallOp *)0x0;
    _Var21._M_pi = local_120.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
    if (local_130.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_130.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var21._M_pi = local_120.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
    }
    break;
  case 0x13:
  case 0x14:
    pPVar15 = (ParserFail *)__cxa_allocate_exception(0x10);
    local_288._0_8_ = pCVar12;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_288,"Operators <= and >= not supported yet","");
    ParserFail::ParserFail(pPVar15,(string *)local_288);
    __cxa_throw(pPVar15,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
  case 0x15:
    paVar23 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
        super__Vector_impl_data._M_finish == paVar23) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    bVar9 = any::is_typed(paVar23,(type_info *)&std::shared_ptr<Omega_h::ExprOp>::typeinfo);
    if (!bVar9) {
      puVar14 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar14 = &PTR__bad_cast_004b86a8;
      __cxa_throw(puVar14,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    peVar5 = (element_type *)(paVar23->storage).dynamic;
    paVar22 = *(pointer *)((long)&paVar23->storage + 8);
    if (paVar22 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
        UNLOCK();
      }
      else {
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
      }
    }
    paVar6 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)paVar6 >> 3) *
               -0x5555555555555555) < 4) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",3);
    }
    bVar9 = any::is_typed(paVar6 + 3,(type_info *)&std::shared_ptr<Omega_h::ExprOp>::typeinfo);
    if (!bVar9) {
      puVar14 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar14 = &PTR__bad_cast_004b86a8;
      __cxa_throw(puVar14,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    peVar7 = (element_type *)paVar6[3].storage.dynamic;
    this_14 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&paVar6[3].storage + 8);
    if (this_14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_14->_M_use_count = this_14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_14->_M_use_count = this_14->_M_use_count + 1;
      }
    }
    this_11 = (EqOp *)operator_new(0x28);
    if (paVar22 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
        UNLOCK();
      }
      else {
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
      }
    }
    if (this_14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_14->_M_use_count = this_14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_14->_M_use_count = this_14->_M_use_count + 1;
      }
    }
    local_150.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar7;
    local_150.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         this_14;
    local_140.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
    local_140.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)paVar22;
    EqOp::EqOp(this_11,&local_140,&local_150);
    local_288._0_8_ = this_11;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Omega_h::EqOp*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8),this_11);
    uVar18 = local_288._8_8_;
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::shared_ptr<Omega_h::ExprOp>>()::table;
    local_288._8_8_ = (pointer)0x0;
    (__return_storage_ptr__->storage).dynamic = (void *)local_288._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->storage + 8) = uVar18;
    local_288._0_8_ = (CallOp *)0x0;
    _Var21._M_pi = local_140.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
    if (local_150.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_150.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var21._M_pi = local_140.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
    }
    break;
  case 0x16:
  case 0x22:
    paVar22 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar17 = ((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)paVar22 >> 3) * -0x5555555555555555;
    if (uVar17 < 3) {
      uVar18 = 2;
      goto LAB_002af2db;
    }
    pvVar13 = paVar22[2].vtable;
    __return_storage_ptr__->vtable = pvVar13;
    if (pvVar13 != (vtable_type *)0x0) {
      (*pvVar13->move)(&paVar22[2].storage,&__return_storage_ptr__->storage);
      paVar22[2].vtable = (vtable_type *)0x0;
    }
    goto LAB_002aef90;
  case 0x17:
    paVar23 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
        super__Vector_impl_data._M_finish == paVar23) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    bVar9 = any::is_typed(paVar23,(type_info *)&std::shared_ptr<Omega_h::ExprOp>::typeinfo);
    if (!bVar9) {
      puVar14 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar14 = &PTR__bad_cast_004b86a8;
      __cxa_throw(puVar14,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    peVar5 = (element_type *)(paVar23->storage).dynamic;
    paVar22 = *(pointer *)((long)&paVar23->storage + 8);
    if (paVar22 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
        UNLOCK();
      }
      else {
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
      }
    }
    paVar6 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)paVar6 >> 3) *
               -0x5555555555555555) < 4) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",3);
    }
    bVar9 = any::is_typed(paVar6 + 3,(type_info *)&std::shared_ptr<Omega_h::ExprOp>::typeinfo);
    if (!bVar9) {
      puVar14 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar14 = &PTR__bad_cast_004b86a8;
      __cxa_throw(puVar14,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    peVar7 = (element_type *)paVar6[3].storage.dynamic;
    this_14 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&paVar6[3].storage + 8);
    if (this_14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_14->_M_use_count = this_14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_14->_M_use_count = this_14->_M_use_count + 1;
      }
    }
    this_08 = (AddOp *)operator_new(0x28);
    if (paVar22 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
        UNLOCK();
      }
      else {
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
      }
    }
    if (this_14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_14->_M_use_count = this_14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_14->_M_use_count = this_14->_M_use_count + 1;
      }
    }
    local_170.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar7;
    local_170.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         this_14;
    local_160.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
    local_160.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)paVar22;
    AddOp::AddOp(this_08,&local_160,&local_170);
    local_288._0_8_ = this_08;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Omega_h::AddOp*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8),this_08);
    uVar18 = local_288._8_8_;
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::shared_ptr<Omega_h::ExprOp>>()::table;
    local_288._8_8_ = (pointer)0x0;
    (__return_storage_ptr__->storage).dynamic = (void *)local_288._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->storage + 8) = uVar18;
    local_288._0_8_ = (CallOp *)0x0;
    _Var21._M_pi = local_160.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
    if (local_170.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_170.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var21._M_pi = local_160.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
    }
    break;
  case 0x18:
    paVar23 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
        super__Vector_impl_data._M_finish == paVar23) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    bVar9 = any::is_typed(paVar23,(type_info *)&std::shared_ptr<Omega_h::ExprOp>::typeinfo);
    if (!bVar9) {
      puVar14 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar14 = &PTR__bad_cast_004b86a8;
      __cxa_throw(puVar14,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    peVar5 = (element_type *)(paVar23->storage).dynamic;
    paVar22 = *(pointer *)((long)&paVar23->storage + 8);
    if (paVar22 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
        UNLOCK();
      }
      else {
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
      }
    }
    paVar6 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)paVar6 >> 3) *
               -0x5555555555555555) < 4) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",3);
    }
    bVar9 = any::is_typed(paVar6 + 3,(type_info *)&std::shared_ptr<Omega_h::ExprOp>::typeinfo);
    if (!bVar9) {
      puVar14 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar14 = &PTR__bad_cast_004b86a8;
      __cxa_throw(puVar14,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    peVar7 = (element_type *)paVar6[3].storage.dynamic;
    this_14 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&paVar6[3].storage + 8);
    if (this_14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_14->_M_use_count = this_14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_14->_M_use_count = this_14->_M_use_count + 1;
      }
    }
    this_03 = (SubOp *)operator_new(0x28);
    if (paVar22 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
        UNLOCK();
      }
      else {
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
      }
    }
    if (this_14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_14->_M_use_count = this_14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_14->_M_use_count = this_14->_M_use_count + 1;
      }
    }
    local_190.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar7;
    local_190.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         this_14;
    local_180.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
    local_180.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)paVar22;
    SubOp::SubOp(this_03,&local_180,&local_190);
    local_288._0_8_ = this_03;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Omega_h::SubOp*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8),this_03);
    uVar18 = local_288._8_8_;
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::shared_ptr<Omega_h::ExprOp>>()::table;
    local_288._8_8_ = (pointer)0x0;
    (__return_storage_ptr__->storage).dynamic = (void *)local_288._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->storage + 8) = uVar18;
    local_288._0_8_ = (CallOp *)0x0;
    _Var21._M_pi = local_180.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
    if (local_190.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_190.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var21._M_pi = local_180.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
    }
    break;
  case 0x19:
    paVar23 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
        super__Vector_impl_data._M_finish == paVar23) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    bVar9 = any::is_typed(paVar23,(type_info *)&std::shared_ptr<Omega_h::ExprOp>::typeinfo);
    if (!bVar9) {
      puVar14 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar14 = &PTR__bad_cast_004b86a8;
      __cxa_throw(puVar14,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    peVar5 = (element_type *)(paVar23->storage).dynamic;
    paVar22 = *(pointer *)((long)&paVar23->storage + 8);
    if (paVar22 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
        UNLOCK();
      }
      else {
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
      }
    }
    paVar6 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)paVar6 >> 3) *
               -0x5555555555555555) < 4) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",3);
    }
    bVar9 = any::is_typed(paVar6 + 3,(type_info *)&std::shared_ptr<Omega_h::ExprOp>::typeinfo);
    if (!bVar9) {
      puVar14 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar14 = &PTR__bad_cast_004b86a8;
      __cxa_throw(puVar14,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    peVar7 = (element_type *)paVar6[3].storage.dynamic;
    this_14 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&paVar6[3].storage + 8);
    if (this_14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_14->_M_use_count = this_14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_14->_M_use_count = this_14->_M_use_count + 1;
      }
    }
    this_02 = (MulOp *)operator_new(0x28);
    if (paVar22 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
        UNLOCK();
      }
      else {
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
      }
    }
    if (this_14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_14->_M_use_count = this_14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_14->_M_use_count = this_14->_M_use_count + 1;
      }
    }
    local_1b0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar7;
    local_1b0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         this_14;
    local_1a0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
    local_1a0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)paVar22;
    MulOp::MulOp(this_02,&local_1a0,&local_1b0);
    local_288._0_8_ = this_02;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Omega_h::MulOp*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8),this_02);
    uVar18 = local_288._8_8_;
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::shared_ptr<Omega_h::ExprOp>>()::table;
    local_288._8_8_ = (pointer)0x0;
    (__return_storage_ptr__->storage).dynamic = (void *)local_288._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->storage + 8) = uVar18;
    local_288._0_8_ = (CallOp *)0x0;
    _Var21._M_pi = local_1a0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
    if (local_1b0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1b0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var21._M_pi = local_1a0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
    }
    break;
  case 0x1a:
    paVar23 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
        super__Vector_impl_data._M_finish == paVar23) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    bVar9 = any::is_typed(paVar23,(type_info *)&std::shared_ptr<Omega_h::ExprOp>::typeinfo);
    if (!bVar9) {
      puVar14 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar14 = &PTR__bad_cast_004b86a8;
      __cxa_throw(puVar14,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    peVar5 = (element_type *)(paVar23->storage).dynamic;
    paVar22 = *(pointer *)((long)&paVar23->storage + 8);
    if (paVar22 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
        UNLOCK();
      }
      else {
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
      }
    }
    paVar6 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)paVar6 >> 3) *
               -0x5555555555555555) < 4) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",3);
    }
    bVar9 = any::is_typed(paVar6 + 3,(type_info *)&std::shared_ptr<Omega_h::ExprOp>::typeinfo);
    if (!bVar9) {
      puVar14 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar14 = &PTR__bad_cast_004b86a8;
      __cxa_throw(puVar14,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    peVar7 = (element_type *)paVar6[3].storage.dynamic;
    this_14 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&paVar6[3].storage + 8);
    if (this_14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_14->_M_use_count = this_14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_14->_M_use_count = this_14->_M_use_count + 1;
      }
    }
    this_09 = (DivOp *)operator_new(0x28);
    if (paVar22 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
        UNLOCK();
      }
      else {
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
      }
    }
    if (this_14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_14->_M_use_count = this_14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_14->_M_use_count = this_14->_M_use_count + 1;
      }
    }
    local_1d0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar7;
    local_1d0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         this_14;
    local_1c0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
    local_1c0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)paVar22;
    DivOp::DivOp(this_09,&local_1c0,&local_1d0);
    local_288._0_8_ = this_09;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Omega_h::DivOp*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8),this_09);
    uVar18 = local_288._8_8_;
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::shared_ptr<Omega_h::ExprOp>>()::table;
    local_288._8_8_ = (pointer)0x0;
    (__return_storage_ptr__->storage).dynamic = (void *)local_288._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->storage + 8) = uVar18;
    local_288._0_8_ = (CallOp *)0x0;
    _Var21._M_pi = local_1c0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
    if (local_1d0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1d0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var21._M_pi = local_1c0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
    }
    break;
  case 0x1b:
    paVar23 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
        super__Vector_impl_data._M_finish == paVar23) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    bVar9 = any::is_typed(paVar23,(type_info *)&std::shared_ptr<Omega_h::ExprOp>::typeinfo);
    if (!bVar9) {
      puVar14 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar14 = &PTR__bad_cast_004b86a8;
      __cxa_throw(puVar14,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    peVar5 = (element_type *)(paVar23->storage).dynamic;
    paVar22 = *(pointer *)((long)&paVar23->storage + 8);
    if (paVar22 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
        UNLOCK();
      }
      else {
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
      }
    }
    paVar6 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)paVar6 >> 3) *
               -0x5555555555555555) < 4) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",3);
    }
    bVar9 = any::is_typed(paVar6 + 3,(type_info *)&std::shared_ptr<Omega_h::ExprOp>::typeinfo);
    if (!bVar9) {
      puVar14 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar14 = &PTR__bad_cast_004b86a8;
      __cxa_throw(puVar14,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    peVar7 = (element_type *)paVar6[3].storage.dynamic;
    this_14 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&paVar6[3].storage + 8);
    if (this_14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_14->_M_use_count = this_14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_14->_M_use_count = this_14->_M_use_count + 1;
      }
    }
    this_10 = (PowOp *)operator_new(0x28);
    if (paVar22 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
        UNLOCK();
      }
      else {
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
      }
    }
    if (this_14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_14->_M_use_count = this_14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_14->_M_use_count = this_14->_M_use_count + 1;
      }
    }
    local_1f0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar7;
    local_1f0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         this_14;
    local_1e0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
    local_1e0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)paVar22;
    PowOp::PowOp(this_10,&local_1e0,&local_1f0);
    local_288._0_8_ = this_10;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Omega_h::PowOp*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8),this_10);
    uVar18 = local_288._8_8_;
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::shared_ptr<Omega_h::ExprOp>>()::table;
    local_288._8_8_ = (pointer)0x0;
    (__return_storage_ptr__->storage).dynamic = (void *)local_288._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->storage + 8) = uVar18;
    local_288._0_8_ = (CallOp *)0x0;
    _Var21._M_pi = local_1e0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
    if (local_1f0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1f0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var21._M_pi = local_1e0.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
    }
    break;
  case 0x1c:
    paVar23 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
        super__Vector_impl_data._M_finish == paVar23) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    bVar9 = any::is_typed(paVar23,(type_info *)&std::__cxx11::string::typeinfo);
    if ((!bVar9) || (psVar4 = (string *)(paVar23->storage).dynamic, psVar4 == (string *)0x0)) {
      puVar14 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar14 = &PTR__bad_cast_004b86a8;
      __cxa_throw(puVar14,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    paVar22 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)(((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)paVar22 >> 3) *
               -0x5555555555555555) < 5) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",4);
    }
    paVar23 = paVar22 + 4;
    bVar9 = any::is_typed(paVar23,(type_info *)
                                  &std::vector<Omega_h::any,std::allocator<Omega_h::any>>::typeinfo)
    ;
    if ((!bVar9) || (args_in = (Args *)(paVar23->storage).dynamic, args_in == (Args *)0x0)) {
      puVar14 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar14 = &PTR__bad_cast_004b86a8;
      __cxa_throw(puVar14,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    pCVar12 = (CallOp *)operator_new(0x58);
    CallOp::CallOp(pCVar12,psVar4,args_in);
    local_288._0_8_ = pCVar12;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Omega_h::CallOp*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8),pCVar12);
    goto LAB_002adf7b;
  case 0x1d:
    local_288._0_8_ = (pointer)0x0;
    local_288._8_8_ = (pointer)0x0;
    local_288._16_8_ = (pointer)0x0;
    __return_storage_ptr__->vtable =
         (vtable_type *)
         any::vtable_for_type<std::vector<Omega_h::any,std::allocator<Omega_h::any>>>()::table;
    puVar14 = (undefined8 *)operator_new(0x18);
    *puVar14 = 0;
    puVar14[1] = 0;
    puVar14[2] = 0;
    goto LAB_002ad98f;
  case 0x1f:
    local_288._0_8_ = (pointer)0x0;
    local_288._8_8_ = (pointer)0x0;
    local_288._16_8_ = (pointer)0x0;
    paVar23 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
        super__Vector_impl_data._M_finish == paVar23) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::emplace_back<Omega_h::any>
              ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)local_288,paVar23);
    __return_storage_ptr__->vtable =
         (vtable_type *)
         any::vtable_for_type<std::vector<Omega_h::any,std::allocator<Omega_h::any>>>()::table;
    puVar14 = (undefined8 *)operator_new(0x18);
    *puVar14 = local_288._0_8_;
    puVar14[1] = local_288._8_8_;
    puVar14[2] = local_288._16_8_;
LAB_002ad98f:
    local_288._16_8_ = (pointer)0x0;
    local_288._8_8_ = (pointer)0x0;
    local_288._0_8_ = (CallOp *)0x0;
    (__return_storage_ptr__->storage).dynamic = puVar14;
    std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::~vector
              ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)local_288);
    goto LAB_002aef90;
  case 0x20:
    paVar23 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
        super__Vector_impl_data._M_finish == paVar23) {
      uVar18 = 0;
      uVar17 = 0;
    }
    else {
      bVar9 = any::is_typed(paVar23,(type_info *)
                                    &std::vector<Omega_h::any,std::allocator<Omega_h::any>>::
                                     typeinfo);
      if ((!bVar9) ||
         (this_00 = (vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)
                    (paVar23->storage).dynamic,
         this_00 == (vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)0x0)) {
        puVar14 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar14 = &PTR__bad_cast_004b86a8;
        __cxa_throw(puVar14,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      paVar22 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar17 = ((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)paVar22 >> 3) * -0x5555555555555555
      ;
      if (3 < uVar17) {
        std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::emplace_back<Omega_h::any>
                  (this_00,paVar22 + 3);
        __return_storage_ptr__->vtable =
             (vtable_type *)
             any::vtable_for_type<std::vector<Omega_h::any,std::allocator<Omega_h::any>>>()::table;
        puVar14 = (undefined8 *)operator_new(0x18);
        paVar22 = (this_00->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl
                  .super__Vector_impl_data._M_finish;
        *puVar14 = (this_00->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        puVar14[1] = paVar22;
        puVar14[2] = (this_00->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
        (this_00->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (this_00->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (this_00->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (__return_storage_ptr__->storage).dynamic = puVar14;
        goto LAB_002aef90;
      }
      uVar18 = 3;
    }
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar18,
               uVar17);
  case 0x21:
    paVar22 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)(((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)paVar22 >> 3) *
               -0x5555555555555555) < 3) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",2);
    }
    bVar9 = any::is_typed(paVar22 + 2,(type_info *)&std::shared_ptr<Omega_h::ExprOp>::typeinfo);
    if (!bVar9) {
      puVar14 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar14 = &PTR__bad_cast_004b86a8;
      __cxa_throw(puVar14,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    peVar5 = (element_type *)paVar22[2].storage.dynamic;
    paVar22 = *(pointer *)((long)&paVar22[2].storage + 8);
    if (paVar22 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
        UNLOCK();
      }
      else {
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
      }
    }
    local_288._0_8_ = operator_new(0x18);
    if (paVar22 == (pointer)0x0) {
      (((pointer)local_288._0_8_)->storage).dynamic = &PTR__NegOp_004b8ae8;
      (((OpPtr *)((long)&((pointer)local_288._0_8_)->storage + 8))->
      super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar5;
      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&((pointer)local_288._0_8_)->vtable)->_M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
        UNLOCK();
        bVar9 = __libc_single_threaded == '\0';
        (((pointer)local_288._0_8_)->storage).dynamic = &PTR__NegOp_004b8ae8;
        (((OpPtr *)((long)&((pointer)local_288._0_8_)->storage + 8))->
        super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar5;
        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&((pointer)local_288._0_8_)->vtable)->_M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)paVar22;
        if (bVar9) {
          LOCK();
          p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
          *p_Var1 = *p_Var1 + 1;
          UNLOCK();
          goto LAB_002ae5d4;
        }
      }
      else {
        p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
        *p_Var1 = *p_Var1 + 1;
        (((pointer)local_288._0_8_)->storage).dynamic = &PTR__NegOp_004b8ae8;
        (((OpPtr *)((long)&((pointer)local_288._0_8_)->storage + 8))->
        super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar5;
        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&((pointer)local_288._0_8_)->vtable)->_M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)paVar22;
      }
      p_Var1 = (_Atomic_word *)((long)&paVar22->storage + 8);
      *p_Var1 = *p_Var1 + 1;
    }
LAB_002ae5d4:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Omega_h::NegOp*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8),
               (NegOp *)local_288._0_8_);
    uVar18 = local_288._8_8_;
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::shared_ptr<Omega_h::ExprOp>>()::table;
    local_288._8_8_ = (pointer)0x0;
    (__return_storage_ptr__->storage).dynamic = (void *)local_288._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->storage + 8) = uVar18;
    local_288._0_8_ = (CallOp *)0x0;
    if (paVar22 == (pointer)0x0) goto LAB_002aef90;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)paVar22);
    goto LAB_002aef8b;
  case 0x24:
    paVar23 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
        super__Vector_impl_data._M_finish == paVar23) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    bVar9 = any::is_typed(paVar23,(type_info *)&std::__cxx11::string::typeinfo);
    if ((!bVar9) || (plVar10 = (long *)(paVar23->storage).dynamic, plVar10 == (long *)0x0)) {
      puVar14 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar14 = &PTR__bad_cast_004b86a8;
      __cxa_throw(puVar14,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    pCVar12 = (CallOp *)operator_new(0x28);
    (pCVar12->super_ExprOp)._vptr_ExprOp = (_func_int **)&PTR__VarOp_004b8aa8;
    (pCVar12->name)._M_dataplus._M_p = (pointer)&(pCVar12->name).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pCVar12->name,*plVar10,plVar10[1] + *plVar10);
    local_288._0_8_ = pCVar12;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Omega_h::VarOp*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8),(VarOp *)pCVar12);
LAB_002adf7b:
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::shared_ptr<Omega_h::ExprOp>>()::table;
    (__return_storage_ptr__->storage).dynamic = (void *)local_288._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->storage + 8) = local_288._8_8_;
    goto LAB_002aef90;
  }
  if ((pointer)_Var21._M_pi != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var21._M_pi);
  }
joined_r0x002aef79:
  if (this_14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_14);
  }
  if (paVar22 != (pointer)0x0) {
LAB_002aef8b:
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)paVar22);
  }
LAB_002aef90:
  ScopedTimer::~ScopedTimer(&local_261);
  return __return_storage_ptr__;
}

Assistant:

any ExprOpsReader::at_reduce(int prod, std::vector<any>& rhs) {
  OMEGA_H_TIME_FUNCTION;
  using std::swap;
  switch (prod) {
    case math_lang::PROD_PROGRAM: {
      if (rhs.at(1).empty()) {
        throw ParserFail(
            "Omega_h::ExprReader needs an expression to evaluate!");
      }
      if (rhs.at(0).empty()) {
        return any(std::move(rhs.at(1)));
      } else {
        auto op_lhs = any_cast<OpPtr>(rhs.at(0));
        auto op_rhs = any_cast<OpPtr>(rhs.at(1));
        return OpPtr(new SemicolonOp(op_lhs, op_rhs));
      }
    }
    case math_lang::PROD_NO_STATEMENTS:
    case math_lang::PROD_NO_EXPR: {
      return any();
    }
    case math_lang::PROD_NEXT_STATEMENT: {
      if (rhs.at(0).empty()) {
        return any(std::move(rhs.at(1)));
      } else {
        auto op_lhs = any_cast<OpPtr>(rhs.at(0));
        auto op_rhs = any_cast<OpPtr>(rhs.at(1));
        return OpPtr(new SemicolonOp(op_lhs, op_rhs));
      }
    }
    case math_lang::PROD_ASSIGN: {
      std::string const& name = any_cast<std::string&>(rhs.at(0));
      OpPtr rhs_op = any_cast<OpPtr>(rhs.at(4));
      return OpPtr(new AssignOp(name, rhs_op));
    }
    case math_lang::PROD_YES_EXPR:
    case math_lang::PROD_EXPR:
    case math_lang::PROD_TERNARY_DECAY:
    case math_lang::PROD_OR_DECAY:
    case math_lang::PROD_AND_DECAY:
    case math_lang::PROD_ADD_SUB_DECAY:
    case math_lang::PROD_MUL_DIV_DECAY:
    case math_lang::PROD_POW_DECAY:
    case math_lang::PROD_NEG_DECAY:
    case math_lang::PROD_SOME_ARGS:
    case math_lang::PROD_CONST:
      return any(std::move(rhs.at(0)));
    case math_lang::PROD_TERNARY: {
      OpPtr cond_op = any_cast<OpPtr>(rhs.at(0));
      OpPtr lhs_op = any_cast<OpPtr>(rhs.at(3));
      OpPtr rhs_op = any_cast<OpPtr>(rhs.at(6));
      return OpPtr(new TernaryOp(cond_op, lhs_op, rhs_op));
    }
    case math_lang::PROD_OR:
      OMEGA_H_BINARY_REDUCE(OrOp)
    case math_lang::PROD_AND:
      OMEGA_H_BINARY_REDUCE(AndOp)
    case math_lang::PROD_GT:
      OMEGA_H_BINARY_REDUCE(GtOp)
    case math_lang::PROD_LT:
      OMEGA_H_BINARY_REDUCE(LtOp)
    case math_lang::PROD_GEQ:
    case math_lang::PROD_LEQ:
      throw ParserFail("Operators <= and >= not supported yet");
    case math_lang::PROD_EQ:
      OMEGA_H_BINARY_REDUCE(EqOp)
    case math_lang::PROD_ADD:
      OMEGA_H_BINARY_REDUCE(AddOp)
    case math_lang::PROD_SUB:
      OMEGA_H_BINARY_REDUCE(SubOp)
    case math_lang::PROD_MUL:
      OMEGA_H_BINARY_REDUCE(MulOp)
    case math_lang::PROD_DIV:
      OMEGA_H_BINARY_REDUCE(DivOp)
    case math_lang::PROD_POW:
      OMEGA_H_BINARY_REDUCE(PowOp)
    case math_lang::PROD_CALL: {
      auto& name = any_cast<std::string&>(rhs.at(0));
      auto& args = any_cast<ExprEnv::Args&>(rhs.at(4));
      return OpPtr(new CallOp(name, args));
    }
    case math_lang::PROD_NO_ARGS:
      return ExprEnv::Args{};
    case math_lang::PROD_FIRST_ARG: {
      ExprEnv::Args args;
      args.push_back(std::move(rhs.at(0)));
      return any(std::move(args));
    }
    case math_lang::PROD_NEXT_ARG: {
      auto& args = any_cast<ExprEnv::Args&>(rhs.at(0));
      args.push_back(std::move(rhs.at(3)));
      return any(std::move(args));
    }
    case math_lang::PROD_NEG: {
      OpPtr rhs_op = any_cast<OpPtr>(rhs.at(2));
      return OpPtr(new NegOp(rhs_op));
    }
    case math_lang::PROD_VAL_PARENS:
    case math_lang::PROD_BOOL_PARENS:
      return any(std::move(rhs.at(2)));
    case math_lang::PROD_VAR: {
      auto& name = any_cast<std::string&>(rhs.at(0));
      return OpPtr(new VarOp(name));
    }
  }
  return any();
}